

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
          (ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
           *this,BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
                 e)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  char *__s;
  Precedence PVar4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> BVar5;
  size_t __n;
  AssertionFailure *this_00;
  Precedence precedence;
  ptrdiff_t _Num;
  ulong uVar6;
  char *str;
  
  PVar4 = mp::expr::precedence
                    (*(Kind *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                              super_ExprBase.impl_);
  BVar5 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                    (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                      super_ExprBase.impl_ + 8));
  precedence = UNARY;
  if (PVar4 != EXPONENTIATION) {
    precedence = PVar4;
  }
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)this,(NumericExpr)BVar5.super_ExprBase.impl_,precedence);
  lVar1 = *(long *)(this + 8);
  puVar2 = *(undefined8 **)(lVar1 + 8);
  if (puVar2[2] == puVar2[3]) {
    (**(code **)*puVar2)(puVar2,puVar2[2] + 1);
  }
  lVar3 = puVar2[2];
  puVar2[2] = lVar3 + 1;
  *(undefined1 *)(puVar2[1] + lVar3) = 0x20;
  if ((ulong)*(uint *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_
      < 0x48) {
    __s = internal::ExprInfo::INFO
          [*(uint *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_].
          str;
    __n = strlen(__s);
    puVar2 = *(undefined8 **)(lVar1 + 8);
    uVar6 = puVar2[2] + __n;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    if (__n != 0) {
      memmove((void *)(puVar2[1] + puVar2[2]),__s,__n);
    }
    puVar2[2] = uVar6;
    puVar2 = *(undefined8 **)(lVar1 + 8);
    if (puVar2[2] == puVar2[3]) {
      (**(code **)*puVar2)(puVar2,puVar2[2] + 1);
    }
    lVar1 = puVar2[2];
    puVar2[2] = lVar1 + 1;
    *(undefined1 *)(puVar2[1] + lVar1) = 0x20;
    BVar5 = internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                      (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                        super_ExprBase.impl_ + 0x10));
    ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
    Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *)this,(NumericExpr)BVar5.super_ExprBase.impl_,(PVar4 != EXPONENTIATION) + PVar4);
    return;
  }
  this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
  AssertionFailure::AssertionFailure(this_00,"invalid expression kind");
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}